

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O0

void dlib::tt::dot_prods(bool add_to,tensor *out,tensor *lhs,tensor *rhs)

{
  byte in_DIL;
  matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
  *in_stack_00000178;
  tensor *in_stack_00000180;
  matrix_exp<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *in_stack_ffffffffffffff38;
  tensor *in_stack_ffffffffffffff48;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *in_stack_ffffffffffffff50;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *in_stack_ffffffffffffff58;
  
  if ((in_DIL & 1) == 0) {
    mat(in_stack_ffffffffffffff48);
    mat(in_stack_ffffffffffffff48);
    pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    sum_cols<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
              (in_stack_ffffffffffffff38);
    tensor::operator=(in_stack_00000180,in_stack_00000178);
  }
  else {
    mat(in_stack_ffffffffffffff48);
    mat(in_stack_ffffffffffffff48);
    pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    sum_cols<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
              (in_stack_ffffffffffffff38);
    tensor::operator+=(in_stack_00000180,in_stack_00000178);
  }
  return;
}

Assistant:

void dot_prods (
        bool add_to,
        tensor& out,
        const tensor& lhs,
        const tensor& rhs
    )
    {
#ifdef DLIB_USE_CUDA
        cuda::dot_prods(add_to, out, lhs, rhs);
#else
        if (add_to)
            out += sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
        else
            out = sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
#endif
    }